

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O3

void __thiscall SMBusAnalyzer::SetupResults(SMBusAnalyzer *this)

{
  SMBusAnalyzerResults *pSVar1;
  SMBusAnalyzerResults *this_00;
  
  this_00 = (SMBusAnalyzerResults *)operator_new(0x20);
  SMBusAnalyzerResults::SMBusAnalyzerResults(this_00,this,&this->mSettings);
  pSVar1 = (this->mResults)._M_ptr;
  if (pSVar1 != this_00) {
    if (pSVar1 != (SMBusAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pSVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void SMBusAnalyzer::SetupResults()
{
    // reset the results
    mResults.reset( new SMBusAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSMBDAT );
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSMBCLK );
}